

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# comparator.cc
# Opt level: O0

void __thiscall
leveldb::anon_unknown_2::BytewiseComparatorImpl::FindShortestSeparator
          (BytewiseComparatorImpl *this,string *start,Slice *limit)

{
  char cVar1;
  byte bVar2;
  char cVar3;
  byte bVar4;
  unsigned_long *puVar5;
  char *pcVar6;
  byte *pbVar7;
  Slice *in_RDX;
  ulong in_RSI;
  bool bVar8;
  uint8_t diff_byte;
  size_t diff_index;
  size_t min_length;
  ulong local_38;
  size_t local_30;
  unsigned_long local_28;
  ulong local_20;
  Slice *local_18;
  ulong local_10;
  
  local_18 = in_RDX;
  local_10 = in_RSI;
  local_28 = std::__cxx11::string::size();
  local_30 = Slice::size(local_18);
  puVar5 = std::min<unsigned_long>(&local_28,&local_30);
  local_20 = *puVar5;
  local_38 = 0;
  while( true ) {
    bVar8 = false;
    if (local_38 < local_20) {
      pcVar6 = (char *)std::__cxx11::string::operator[](local_10);
      cVar1 = *pcVar6;
      cVar3 = Slice::operator[](local_18,local_38);
      bVar8 = cVar1 == cVar3;
    }
    if (!bVar8) break;
    local_38 = local_38 + 1;
  }
  if (local_38 < local_20) {
    pbVar7 = (byte *)std::__cxx11::string::operator[](local_10);
    bVar2 = *pbVar7;
    if ((bVar2 != 0xff) && (bVar4 = Slice::operator[](local_18,local_38), bVar2 + 1 < (uint)bVar4))
    {
      pcVar6 = (char *)std::__cxx11::string::operator[](local_10);
      *pcVar6 = *pcVar6 + '\x01';
      std::__cxx11::string::resize(local_10);
    }
  }
  return;
}

Assistant:

void FindShortestSeparator(std::string* start,
                             const Slice& limit) const override {
    // Find length of common prefix
    size_t min_length = std::min(start->size(), limit.size());
    size_t diff_index = 0;
    while ((diff_index < min_length) &&
           ((*start)[diff_index] == limit[diff_index])) {
      diff_index++;
    }

    if (diff_index >= min_length) {
      // Do not shorten if one string is a prefix of the other
    } else {
      uint8_t diff_byte = static_cast<uint8_t>((*start)[diff_index]);
      if (diff_byte < static_cast<uint8_t>(0xff) &&
          diff_byte + 1 < static_cast<uint8_t>(limit[diff_index])) {
        (*start)[diff_index]++;
        start->resize(diff_index + 1);
        assert(Compare(*start, limit) < 0);
      }
    }
  }